

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

_Bool duckdb_je_stats_boot(void)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t interval;
  
  if (duckdb_je_opt_stats_interval < 0) {
    interval = 0;
    stats_interval_accum_batch = 0;
  }
  else {
    interval = duckdb_je_opt_stats_interval + (ulong)(duckdb_je_opt_stats_interval == 0);
    uVar2 = 1;
    if (0x3f < (ulong)duckdb_je_opt_stats_interval) {
      uVar2 = interval >> 6;
    }
    stats_interval_accum_batch = 0x400000;
    if ((ulong)duckdb_je_opt_stats_interval < 0x10000040) {
      stats_interval_accum_batch = uVar2;
    }
  }
  _Var1 = duckdb_je_counter_accum_init(&stats_interval_accumulated,interval);
  return _Var1;
}

Assistant:

bool
stats_boot(void) {
	uint64_t stats_interval;
	if (opt_stats_interval < 0) {
		assert(opt_stats_interval == -1);
		stats_interval = 0;
		stats_interval_accum_batch = 0;
	} else{
		/* See comments in stats.h */
		stats_interval = (opt_stats_interval > 0) ?
		    opt_stats_interval : 1;
		uint64_t batch = stats_interval >>
		    STATS_INTERVAL_ACCUM_LG_BATCH_SIZE;
		if (batch > STATS_INTERVAL_ACCUM_BATCH_MAX) {
			batch = STATS_INTERVAL_ACCUM_BATCH_MAX;
		} else if (batch == 0) {
			batch = 1;
		}
		stats_interval_accum_batch = batch;
	}

	return counter_accum_init(&stats_interval_accumulated, stats_interval);
}